

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
 testing::internal::
 ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
           (const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
            begin,const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  end,int *elem)

{
  reference piVar1;
  size_type sVar2;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar3;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  cVar4;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  local_30;
  
  sVar2 = begin.pos;
  local_30.table = begin.table;
  while ((local_30.pos = end.pos, psVar3 = end.table,
         sVar2 != end.pos || local_30.table != end.table &&
         (local_30.pos = sVar2,
         piVar1 = google::
                  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  ::operator*(&local_30), psVar3 = local_30.table, *piVar1 != *elem))) {
    sVar2 = local_30.pos + 1;
  }
  cVar4.pos = local_30.pos;
  cVar4.table = psVar3;
  return cVar4;
}

Assistant:

Iter ArrayAwareFind(Iter begin, Iter end, const Element& elem) {
  for (Iter it = begin; it != end; ++it) {
    if (internal::ArrayEq(*it, elem)) return it;
  }
  return end;
}